

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cxx
# Opt level: O3

bool crt_pid_file(pid_t pid,string *path)

{
  bool bVar1;
  bool local_31;
  string local_30;
  
  to_str_abi_cxx11_(&local_30,pid);
  local_31 = false;
  bVar1 = write_file(path,&local_30,&local_31);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool crt_pid_file(const pid_t pid, const std::string &path) {
    return write_file(path, to_str(pid));
}